

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,XML_Bool isCdata,XML_Bool isId,
                   XML_Char *value,XML_Parser parser)

{
  uint uVar1;
  int iVar2;
  DEFAULT_ATTRIBUTE *pDVar3;
  undefined7 in_register_00000009;
  long lVar4;
  
  uVar1 = type->nDefaultAtts;
  if ((int)CONCAT71(in_register_00000009,isId) != 0 || value != (XML_Char *)0x0) {
    if (0 < (int)uVar1) {
      lVar4 = 0;
      do {
        if (*(ATTRIBUTE_ID **)((long)&type->defaultAtts->id + lVar4) == attId) {
          return 1;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar4);
    }
    if (((isId != '\0') && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
      type->idAtt = attId;
    }
  }
  if (uVar1 == type->allocDefaultAtts) {
    if (uVar1 == 0) {
      type->allocDefaultAtts = 8;
      pDVar3 = (DEFAULT_ATTRIBUTE *)(*(parser->m_mem).malloc_fcn)(0xc0);
      type->defaultAtts = pDVar3;
      if (pDVar3 == (DEFAULT_ATTRIBUTE *)0x0) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      if (0x3fffffff < (int)uVar1) {
        return 0;
      }
      pDVar3 = (DEFAULT_ATTRIBUTE *)
               (*(parser->m_mem).realloc_fcn)(type->defaultAtts,(long)(int)uVar1 * 0x30);
      if (pDVar3 == (DEFAULT_ATTRIBUTE *)0x0) {
        return 0;
      }
      type->allocDefaultAtts = uVar1 * 2;
      type->defaultAtts = pDVar3;
    }
  }
  else {
    pDVar3 = type->defaultAtts;
  }
  iVar2 = type->nDefaultAtts;
  pDVar3[iVar2].id = attId;
  pDVar3[iVar2].value = value;
  pDVar3[iVar2].isCdata = isCdata;
  if (isCdata == '\0') {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = iVar2 + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, XML_Bool isCdata,
                XML_Bool isId, const XML_Char *value, XML_Parser parser) {
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && ! type->idAtt && ! attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = (DEFAULT_ATTRIBUTE *)MALLOC(
          parser, type->allocDefaultAtts * sizeof(DEFAULT_ATTRIBUTE));
      if (! type->defaultAtts) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    } else {
      DEFAULT_ATTRIBUTE *temp;

      /* Detect and prevent integer overflow */
      if (type->allocDefaultAtts > INT_MAX / 2) {
        return 0;
      }

      int count = type->allocDefaultAtts * 2;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if ((unsigned)count > (size_t)(-1) / sizeof(DEFAULT_ATTRIBUTE)) {
        return 0;
      }
#endif

      temp = (DEFAULT_ATTRIBUTE *)REALLOC(parser, type->defaultAtts,
                                          (count * sizeof(DEFAULT_ATTRIBUTE)));
      if (temp == NULL)
        return 0;
      type->allocDefaultAtts = count;
      type->defaultAtts = temp;
    }
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (! isCdata)
    attId->maybeTokenized = XML_TRUE;
  type->nDefaultAtts += 1;
  return 1;
}